

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O2

HighsStatus __thiscall Highs::resetHighsOptions(Highs *this)

{
  HighsStatus HVar1;
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"resetHighsOptions",&local_49);
  std::__cxx11::string::string((string *)&local_48,"resetOptions",&local_4a);
  deprecationMessage(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  HVar1 = resetOptions(this);
  return HVar1;
}

Assistant:

HighsStatus Highs::resetHighsOptions() {
  deprecationMessage("resetHighsOptions", "resetOptions");
  return resetOptions();
}